

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIPNode *
PVIP_node_new_children3
          (PVIPParserContext *parser,PVIP_node_type_t type,PVIPNode *n1,PVIPNode *n2,PVIPNode *n3)

{
  PVIPNode *node_00;
  PVIPNode *node;
  PVIPNode *n3_local;
  PVIPNode *n2_local;
  PVIPNode *n1_local;
  PVIP_node_type_t type_local;
  PVIPParserContext *parser_local;
  
  if (n1 == (PVIPNode *)0x0) {
    __assert_fail("n1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0xe7,
                  "PVIPNode *PVIP_node_new_children3(PVIPParserContext *, PVIP_node_type_t, PVIPNode *, PVIPNode *, PVIPNode *)"
                 );
  }
  if (n2 != (PVIPNode *)0x0) {
    if (n3 != (PVIPNode *)0x0) {
      node_00 = PVIP_node_new_children(parser,type);
      PVIP_node_push_child(node_00,n1);
      PVIP_node_push_child(node_00,n2);
      PVIP_node_push_child(node_00,n3);
      return node_00;
    }
    __assert_fail("n3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0xe9,
                  "PVIPNode *PVIP_node_new_children3(PVIPParserContext *, PVIP_node_type_t, PVIPNode *, PVIPNode *, PVIPNode *)"
                 );
  }
  __assert_fail("n2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,0xe8,
                "PVIPNode *PVIP_node_new_children3(PVIPParserContext *, PVIP_node_type_t, PVIPNode *, PVIPNode *, PVIPNode *)"
               );
}

Assistant:

PVIPNode* PVIP_node_new_children3(PVIPParserContext* parser, PVIP_node_type_t type, PVIPNode* n1, PVIPNode *n2, PVIPNode *n3) {
    assert(n1);
    assert(n2);
    assert(n3);

    PVIPNode* node = PVIP_node_new_children(parser, type);
    PVIP_node_push_child(node, n1);
    PVIP_node_push_child(node, n2);
    PVIP_node_push_child(node, n3);
    return node;
}